

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void pstack::
     print_container<std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,pstack::Elf::Object_const*const&>
               (ostream *os,long *container,Object **ctx)

{
  Elf64_Phdr *pEVar1;
  size_t sVar2;
  char *__s;
  Elf64_Phdr *field;
  Elf64_Phdr *pEVar3;
  JSON<Elf64_Phdr,_const_pstack::Elf::Object_*> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  pEVar3 = (Elf64_Phdr *)*container;
  pEVar1 = (Elf64_Phdr *)container[1];
  if (pEVar3 != pEVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      local_40.object = pEVar3;
      local_40.context = ctx;
      operator<<(os,&local_40);
      pEVar3 = pEVar3 + 1;
      __s = ",\n";
    } while (pEVar3 != pEVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}